

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

bool __thiscall
CoreML::Specification::LayerNormalizationLayerParams::MergePartialFromCodedStream
          (LayerNormalizationLayerParams *this,CodedInputStream *input)

{
  byte bVar1;
  byte *pbVar2;
  float *pfVar3;
  bool bVar4;
  uint32 uVar5;
  int iVar6;
  ulong extraout_RAX;
  WeightParams *pWVar7;
  ulong extraout_RAX_00;
  char cVar8;
  ulong uVar9;
  uint8 **ppuVar10;
  float local_54;
  uint8 **local_50;
  int local_48;
  int local_44;
  WeightParams **local_40;
  WeightParams **local_38;
  
  ppuVar10 = &input->buffer_end_;
  local_38 = &this->beta_;
  local_40 = &this->gamma_;
  do {
    pbVar2 = input->buffer_;
    uVar5 = 0;
    if (pbVar2 < input->buffer_end_) {
      bVar1 = *pbVar2;
      uVar5 = (uint32)bVar1;
      if ((char)bVar1 < '\x01') goto LAB_00258492;
      input->buffer_ = pbVar2 + 1;
      uVar9 = (ulong)bVar1 | 0x100000000;
    }
    else {
LAB_00258492:
      uVar5 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar5);
      uVar9 = 0;
      if (uVar5 - 1 < 0x7f) {
        uVar9 = 0x100000000;
      }
      uVar9 = uVar5 | uVar9;
    }
    uVar5 = (uint32)uVar9;
    if ((uVar9 & 0x100000000) == 0) {
switchD_002584fb_default:
      iVar6 = 7;
      if ((uVar5 & 7) != 4 && uVar5 != 0) {
        bVar4 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar5);
LAB_002584d4:
        if (bVar4 != false) goto LAB_002584dc;
LAB_00258633:
        iVar6 = 6;
      }
    }
    else {
      cVar8 = (char)uVar9;
      switch((uint)(uVar9 >> 3) & 0x1fffffff) {
      case 1:
        if (cVar8 == '\b') {
          bVar4 = google::protobuf::internal::WireFormatLite::
                  ReadRepeatedPrimitive<long,(google::protobuf::internal::WireFormatLite::FieldType)3>
                            (1,10,input,&this->normalizedshape_);
        }
        else {
          if ((uVar5 & 0xff) != 10) goto switchD_002584fb_default;
          bVar4 = google::protobuf::internal::WireFormatLite::
                  ReadPackedPrimitive<long,(google::protobuf::internal::WireFormatLite::FieldType)3>
                            (input,&this->normalizedshape_);
        }
        goto LAB_002584d4;
      case 2:
        if (cVar8 != '\x15') goto switchD_002584fb_default;
        pfVar3 = (float *)input->buffer_;
        if (3 < *(int *)&input->buffer_end_ - (int)pfVar3) {
          local_54 = *pfVar3;
          input->buffer_ = (uint8 *)(pfVar3 + 1);
LAB_002585f7:
          this->eps_ = local_54;
          goto LAB_002584dc;
        }
        bVar4 = google::protobuf::io::CodedInputStream::ReadLittleEndian32Fallback
                          (input,(uint32 *)&local_54);
        if (bVar4) goto LAB_002585f7;
        goto LAB_00258633;
      case 3:
        if (cVar8 != '\x1a') goto switchD_002584fb_default;
        if (*local_40 == (WeightParams *)0x0) {
          local_50 = ppuVar10;
          pWVar7 = (WeightParams *)operator_new(0x50);
          WeightParams::WeightParams(pWVar7);
          *local_40 = pWVar7;
          ppuVar10 = local_50;
        }
        MergePartialFromCodedStream();
        iVar6 = local_44;
        if ((extraout_RAX & 1) != 0) break;
LAB_002584dc:
        iVar6 = 0;
        break;
      case 4:
        if (cVar8 != '\"') goto switchD_002584fb_default;
        if (*local_38 == (WeightParams *)0x0) {
          local_50 = ppuVar10;
          pWVar7 = (WeightParams *)operator_new(0x50);
          WeightParams::WeightParams(pWVar7);
          *local_38 = pWVar7;
          ppuVar10 = local_50;
        }
        MergePartialFromCodedStream();
        iVar6 = local_48;
        if ((extraout_RAX_00 & 1) == 0) goto LAB_002584dc;
        break;
      default:
        goto switchD_002584fb_default;
      }
    }
    if (iVar6 != 0) {
      return iVar6 != 6;
    }
  } while( true );
}

Assistant:

bool LayerNormalizationLayerParams::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.LayerNormalizationLayerParams)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // repeated int64 normalizedShape = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(10u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadPackedPrimitive<
                   ::google::protobuf::int64, ::google::protobuf::internal::WireFormatLite::TYPE_INT64>(
                 input, this->mutable_normalizedshape())));
        } else if (static_cast< ::google::protobuf::uint8>(tag) ==
                   static_cast< ::google::protobuf::uint8>(8u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadRepeatedPrimitiveNoInline<
                   ::google::protobuf::int64, ::google::protobuf::internal::WireFormatLite::TYPE_INT64>(
                 1, 10u, input, this->mutable_normalizedshape())));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // float eps = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(21u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   float, ::google::protobuf::internal::WireFormatLite::TYPE_FLOAT>(
                 input, &eps_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.WeightParams gamma = 3;
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(26u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_gamma()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.WeightParams beta = 4;
      case 4: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(34u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_beta()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.LayerNormalizationLayerParams)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.LayerNormalizationLayerParams)
  return false;
#undef DO_
}